

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carLot.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_2c;
  undefined1 local_28 [4];
  int choice;
  vector<Car,_std::allocator<Car>_> cars;
  
  cars.super__Vector_base<Car,_std::allocator<Car>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<Car,_std::allocator<Car>_>::vector((vector<Car,_std::allocator<Car>_> *)local_28);
  do {
    local_2c = 0;
    poVar1 = std::operator<<((ostream *)&std::cout,"Welcome to the car inventory system!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Please chose a number:");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"1) Add car");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"2) List inventory");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"3) Display profit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"4) Quit");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Choice [1-4]: ");
    std::istream::operator>>((istream *)&std::cin,&local_2c);
    switch(local_2c) {
    case 1:
      AddCar((vector<Car,_std::allocator<Car>_> *)local_28);
      break;
    case 2:
      PrintInventory((vector<Car,_std::allocator<Car>_> *)local_28);
      break;
    case 3:
      CalculateProfit((vector<Car,_std::allocator<Car>_> *)local_28);
      break;
    case 4:
      exit(0);
    }
  } while( true );
}

Assistant:

int main()
{
    vector<Car> cars;

    do
    {
        int choice = 0;

        cout << "Welcome to the car inventory system!" << endl;
        cout << "Please chose a number:" << endl << endl;
        cout << "1) Add car" << endl;
        cout << "2) List inventory" << endl;
        cout << "3) Display profit" << endl;
        cout << "4) Quit" << endl;
        cout << "Choice [1-4]: ";

        cin >> choice;

        switch(choice)
        {
            case 1:
                AddCar(cars);
                break;
            case 2:
                PrintInventory(cars);
                break;
            case 3:
                CalculateProfit(cars);
                break;
            case 4:
                exit(0);
            default:
                break;
        }

    }
    while(true);

    return 0;
}